

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ValuePlusArgsFunction::checkArguments
          (ValuePlusArgsFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *arg;
  reference ppEVar2;
  SourceLocation in_RCX;
  ASTContext *in_RDX;
  SystemSubroutine *in_RSI;
  SourceLocation in_RDI;
  undefined8 in_R9;
  undefined1 isMethod;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  Type *st;
  Type *ft;
  Compilation *comp;
  Type *pTVar3;
  SourceLocation in_stack_ffffffffffffff88;
  Expression *in_stack_ffffffffffffff90;
  ASTContext *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  SourceLocation SVar4;
  Type *local_8;
  
  isMethod = (undefined1)((ulong)in_R9 >> 0x38);
  SVar4 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0x77c33b);
  pTVar3 = (Type *)0x2;
  callRange.endLoc = in_RCX;
  callRange.startLoc = SVar4;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RSI,in_RDX,(bool)isMethod,(Args *)this_00,callRange,unaff_retaddr,
                     in_stack_00000008);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
    arg = not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0x77c3c3);
    bVar1 = Type::canBeStringLike(pTVar3);
    if (bVar1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,1);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x77c467);
      bVar1 = Type::canBeStringLike(pTVar3);
      if ((!bVar1) && (bVar1 = Type::isFloating((Type *)0x77c484), !bVar1)) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                  ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,1);
        pTVar3 = SystemSubroutine::badArg
                           ((SystemSubroutine *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        return pTVar3;
      }
      local_8 = Compilation::getIntType(this_00);
    }
    else {
      ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           in_RDX,0);
      sourceRange.endLoc = in_stack_ffffffffffffff88;
      sourceRange.startLoc = in_RDI;
      ASTContext::addDiag((ASTContext *)in_RSI,SUB84(((*ppEVar2)->sourceRange).startLoc,4),
                          sourceRange);
      ast::operator<<((Diagnostic *)in_RCX,arg);
      local_8 = Compilation::getErrorType(this_00);
    }
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 2))
            return comp.getErrorType();

        const Type& ft = *args[0]->type;
        if (!ft.canBeStringLike()) {
            context.addDiag(diag::InvalidStringArg, args[0]->sourceRange) << ft;
            return comp.getErrorType();
        }

        // TODO: if the first argument is known at compile time, do more specific
        // checking of the second argument.
        const Type& st = *args[1]->type;
        if (!st.canBeStringLike() && !st.isFloating())
            return badArg(context, *args[1]);

        return comp.getIntType();
    }